

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O1

int __thiscall ktx::OptionsSingleIn::init(OptionsSingleIn *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined4 uVar2;
  int iVar3;
  int extraout_EAX;
  OptionAdder *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  size_type local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  string local_1a8;
  element_type *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_180;
  element_type *local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_170;
  string local_160;
  OptionAdder local_140;
  shared_ptr<const_cxxopts::Value> local_118;
  shared_ptr<const_cxxopts::Value> local_108;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_1c8 = &local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
  uVar2 = local_1b8._M_allocated_capacity._0_4_;
  local_140.m_group._M_string_length = local_1c0;
  paVar1 = &local_1a8.field_2;
  if (local_1c8 == &local_1b8) {
    local_1a8.field_2._8_4_ = local_1b8._8_4_;
    local_1a8.field_2._12_4_ = local_1b8._12_4_;
    local_1a8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1a8._M_dataplus._M_p = (pointer)local_1c8;
  }
  local_1a8.field_2._M_allocated_capacity._4_4_ = local_1b8._M_allocated_capacity._4_4_;
  local_1a8.field_2._M_allocated_capacity._0_4_ = local_1b8._M_allocated_capacity._0_4_;
  local_1a8._M_string_length = local_1c0;
  local_1c0 = 0;
  local_1b8._M_allocated_capacity._0_4_ = local_1b8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_140.m_group._M_dataplus._M_p = (pointer)&local_140.m_group.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p == paVar1) {
    local_140.m_group.field_2._M_allocated_capacity =
         CONCAT44(local_1b8._M_allocated_capacity._4_4_,uVar2);
    local_140.m_group.field_2._8_4_ = local_1a8.field_2._8_4_;
    local_140.m_group.field_2._12_4_ = local_1a8.field_2._12_4_;
  }
  else {
    local_140.m_group._M_dataplus._M_p = local_1a8._M_dataplus._M_p;
    local_140.m_group.field_2._M_allocated_capacity = local_1a8.field_2._M_allocated_capacity;
  }
  local_1c8 = &local_1b8;
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  local_140.m_options = (Options *)ctx;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"stdin","");
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_160,
             "Use stdin as the input file. (Using a single dash \'-\' as the input file has the same effect)"
             ,"");
  cxxopts::value<bool>();
  local_108.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_178;
  local_108.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_170;
  local_178 = (element_type *)0x0;
  p_Stack_170 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
  this_00 = cxxopts::OptionAdder::operator()(&local_140,&local_1a8,&local_160,&local_108,&local_90);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"i,input-file","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "The input file. Using a single dash \'-\' as the input file will use stdin.","");
  cxxopts::value<std::__cxx11::string>();
  local_118.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_188;
  local_118.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Stack_180;
  local_188 = (element_type *)0x0;
  p_Stack_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"filepath","");
  cxxopts::OptionAdder::operator()(this_00,&local_b0,&local_d0,&local_118,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_118.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_180);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_108.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (p_Stack_170 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_170);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140.m_group._M_dataplus._M_p != &local_140.m_group.field_2) {
    operator_delete(local_140.m_group._M_dataplus._M_p,
                    local_140.m_group.field_2._M_allocated_capacity + 1);
  }
  if (local_1c8 != &local_1b8) {
    operator_delete(local_1c8,
                    CONCAT44(local_1b8._M_allocated_capacity._4_4_,
                             local_1b8._M_allocated_capacity._0_4_) + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"input-file","");
  cxxopts::Options::parse_positional((Options *)ctx,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"<input-file>","");
  iVar3 = std::__cxx11::string::operator=((string *)(ctx + 0x60),(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
    iVar3 = extraout_EAX;
  }
  return iVar3;
}

Assistant:

void init(cxxopts::Options& opts) {
        opts.add_options()
                ("stdin", "Use stdin as the input file. (Using a single dash '-' as the input file has the same effect)")
                ("i,input-file", "The input file. Using a single dash '-' as the input file will use stdin.", cxxopts::value<std::string>(), "filepath");
        opts.parse_positional("input-file");
        opts.positional_help("<input-file>");
    }